

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::RawMessageSet::ByteSizeLong(RawMessageSet *this)

{
  bool bVar1;
  int iVar2;
  RepeatedPtrField<proto2_unittest::RawMessageSet_Item> *this_00;
  reference value;
  size_t sVar3;
  RawMessageSet_Item *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<proto2_unittest::RawMessageSet_Item> *__range2;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  RawMessageSet *this_;
  RawMessageSet *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar2 = _internal_item_size(this);
  sStack_58 = (long)iVar2 * 2;
  this_00 = _internal_item(this);
  __end2 = google::protobuf::RepeatedPtrField<proto2_unittest::RawMessageSet_Item>::begin(this_00);
  msg = (RawMessageSet_Item *)
        google::protobuf::RepeatedPtrField<proto2_unittest::RawMessageSet_Item>::end(this_00);
  while( true ) {
    bVar1 = google::protobuf::internal::operator!=(&__end2,(iterator *)&msg);
    if (!bVar1) break;
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_proto2_unittest::RawMessageSet_Item>::operator*(&__end2);
    sVar3 = google::protobuf::internal::WireFormatLite::
            GroupSize<proto2_unittest::RawMessageSet_Item>(value);
    sStack_58 = sVar3 + sStack_58;
    google::protobuf::internal::RepeatedPtrIterator<const_proto2_unittest::RawMessageSet_Item>::
    operator++(&__end2);
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t RawMessageSet::ByteSizeLong() const {
  const RawMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.RawMessageSet)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated group Item = 1 { ... };
    {
      total_size += 2UL * this_._internal_item_size();
      for (const auto& msg : this_._internal_item()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}